

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O0

void __thiscall IR::PragmaInstr::Dump(PragmaInstr *this,IRDumpFlags flags)

{
  bool bVar1;
  JITTimeFunctionBody *this_00;
  Utf8SourceInfo *this_01;
  FunctionBody *local_20;
  FunctionBody *functionBody;
  IRDumpFlags flags_local;
  PragmaInstr *this_local;
  
  if (((DAT_01eb89eb & 1) != 0) && ((this->super_Instr).m_opcode == StatementBoundary)) {
    local_20 = (FunctionBody *)0x0;
    bVar1 = Func::IsOOPJIT((this->super_Instr).m_func);
    if (!bVar1) {
      this_00 = Func::GetJITFunctionBody((this->super_Instr).m_func);
      local_20 = (FunctionBody *)JITTimeFunctionBody::GetAddr(this_00);
    }
    if (local_20 != (FunctionBody *)0x0) {
      this_01 = Js::FunctionProxy::GetUtf8SourceInfo((FunctionProxy *)local_20);
      bVar1 = Js::Utf8SourceInfo::GetIsLibraryCode(this_01);
      if (!bVar1) {
        Js::FunctionBody::PrintStatementSourceLine(local_20,this->m_statementIndex);
      }
    }
  }
  Instr::Dump(&this->super_Instr,flags);
  return;
}

Assistant:

void
PragmaInstr::Dump(IRDumpFlags flags)
{
    if (Js::Configuration::Global.flags.PrintSrcInDump && this->m_opcode == Js::OpCode::StatementBoundary)
    {
        Js::FunctionBody * functionBody = nullptr;
        if (!m_func->IsOOPJIT())
        {
            functionBody = ((Js::FunctionBody*)m_func->GetJITFunctionBody()->GetAddr());
        }
        if (functionBody && !functionBody->GetUtf8SourceInfo()->GetIsLibraryCode())
        {
            functionBody->PrintStatementSourceLine(this->m_statementIndex);
        }
    }
    __super::Dump(flags);
}